

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_window_update
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,
              int32_t window_size_increment)

{
  int local_38;
  int32_t local_34;
  nghttp2_stream *local_30;
  nghttp2_stream *stream;
  int rv;
  int32_t window_size_increment_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  local_30 = (nghttp2_stream *)0x0;
  if (window_size_increment == 0) {
    session_local._4_4_ = 0;
  }
  else {
    stream._4_4_ = window_size_increment;
    rv = stream_id;
    window_size_increment_local._3_1_ = flags;
    _stream_id_local = session;
    if (stream_id == 0) {
      session_local._4_4_ =
           nghttp2_adjust_local_window_size
                     (&session->local_window_size,&session->recv_window_size,
                      &session->recv_reduction,(int32_t *)((long)&stream + 4));
    }
    else {
      local_30 = nghttp2_session_get_stream(session,stream_id);
      if (local_30 == (nghttp2_stream *)0x0) {
        return 0;
      }
      session_local._4_4_ =
           nghttp2_adjust_local_window_size
                     (&local_30->local_window_size,&local_30->recv_window_size,
                      &local_30->recv_reduction,(int32_t *)((long)&stream + 4));
    }
    if (session_local._4_4_ == 0) {
      stream._0_4_ = 0;
      if (stream._4_4_ < 1) {
        session_local._4_4_ = 0;
      }
      else {
        if (rv == 0) {
          if (_stream_id_local->consumed_size - stream._4_4_ < 0) {
            local_34 = 0;
          }
          else {
            local_34 = _stream_id_local->consumed_size - stream._4_4_;
          }
          _stream_id_local->consumed_size = local_34;
        }
        else {
          if (local_30->consumed_size - stream._4_4_ < 0) {
            local_38 = 0;
          }
          else {
            local_38 = local_30->consumed_size - stream._4_4_;
          }
          local_30->consumed_size = local_38;
        }
        session_local._4_4_ =
             nghttp2_session_add_window_update(_stream_id_local,'\0',rv,stream._4_4_);
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_window_update(nghttp2_session *session, uint8_t flags,
                                 int32_t stream_id,
                                 int32_t window_size_increment) {
  int rv;
  nghttp2_stream *stream = 0;
  (void)flags;

  if (window_size_increment == 0) {
    return 0;
  }
  if (stream_id == 0) {
    rv = nghttp2_adjust_local_window_size(
        &session->local_window_size, &session->recv_window_size,
        &session->recv_reduction, &window_size_increment);
    if (rv != 0) {
      return rv;
    }
  } else {
    stream = nghttp2_session_get_stream(session, stream_id);
    if (!stream) {
      return 0;
    }

    rv = nghttp2_adjust_local_window_size(
        &stream->local_window_size, &stream->recv_window_size,
        &stream->recv_reduction, &window_size_increment);
    if (rv != 0) {
      return rv;
    }
  }

  if (window_size_increment > 0) {
    if (stream_id == 0) {
      session->consumed_size =
          nghttp2_max(0, session->consumed_size - window_size_increment);
    } else {
      stream->consumed_size =
          nghttp2_max(0, stream->consumed_size - window_size_increment);
    }

    return nghttp2_session_add_window_update(session, 0, stream_id,
                                             window_size_increment);
  }
  return 0;
}